

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O0

void ncnn::draw_line_c4(uchar *pixels,int w,int h,int stride,int x0,int y0,int x1,int y1,uint color,
                       int thickness)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int *piVar6;
  long lVar7;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar8;
  float t;
  int x;
  uchar *p;
  int in_stack_00000010;
  int y;
  int y_max;
  int y_min;
  int x_max;
  int x_min;
  float t1;
  float t0;
  uchar *pen_color;
  int local_54;
  int local_44;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  fVar8 = (float)x_max / 2.0;
  t = (float)x_max - fVar8;
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  piVar6 = std::min<int>(&local_18,(int *)&p);
  iVar1 = *piVar6;
  piVar6 = std::max<int>(&local_18,(int *)&p);
  iVar2 = *piVar6;
  piVar6 = std::min<int>(&local_1c,&stack0x00000010);
  iVar3 = *piVar6;
  piVar6 = std::max<int>(&local_1c,&stack0x00000010);
  iVar4 = *piVar6;
  local_44 = (int)((float)iVar3 - fVar8);
  do {
    if ((float)iVar4 + t <= (float)local_44) {
      return;
    }
    if (-1 < local_44) {
      if (local_10 <= local_44) {
        return;
      }
      lVar7 = local_8 + local_14 * local_44;
      for (local_54 = (int)((float)iVar1 - fVar8); (float)local_54 < (float)iVar2 + t;
          local_54 = local_54 + 1) {
        if (-1 < local_54) {
          if (local_c <= local_54) break;
          bVar5 = distance_lessthan(local_54,local_44,local_18,local_1c,(int)p,in_stack_00000010,t);
          if (bVar5) {
            *(undefined1 *)(lVar7 + (local_54 << 2)) = (undefined1)y_max;
            *(undefined1 *)(lVar7 + (local_54 * 4 + 1)) = y_max._1_1_;
            *(undefined1 *)(lVar7 + (local_54 * 4 + 2)) = y_max._2_1_;
            *(undefined1 *)(lVar7 + (local_54 * 4 + 3)) = y_max._3_1_;
          }
        }
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void draw_line_c4(unsigned char* pixels, int w, int h, int stride, int x0, int y0, int x1, int y1, unsigned int color, int thickness)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    const float t0 = thickness / 2.f;
    const float t1 = thickness - t0;

    int x_min = std::min(x0, x1);
    int x_max = std::max(x0, x1);
    int y_min = std::min(y0, y1);
    int y_max = std::max(y0, y1);

    for (int y = y_min - t0; y < y_max + t1; y++)
    {
        if (y < 0)
            continue;

        if (y >= h)
            break;

        unsigned char* p = pixels + stride * y;

        for (int x = x_min - t0; x < x_max + t1; x++)
        {
            if (x < 0)
                continue;

            if (x >= w)
                break;

            // distance from line
            if (distance_lessthan(x, y, x0, y0, x1, y1, t1))
            {
                p[x * 4 + 0] = pen_color[0];
                p[x * 4 + 1] = pen_color[1];
                p[x * 4 + 2] = pen_color[2];
                p[x * 4 + 3] = pen_color[3];
            }
        }
    }
}